

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_40de8e::InlineImageTracker::InlineImageTracker
          (InlineImageTracker *this,QPDF *qpdf,size_t min_size,QPDFObjectHandle *resources)

{
  QPDFObjectHandle *resources_local;
  size_t min_size_local;
  QPDF *qpdf_local;
  InlineImageTracker *this_local;
  
  QPDFObjectHandle::TokenFilter::TokenFilter(&this->super_TokenFilter);
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__InlineImageTracker_0058edc0;
  this->qpdf = qpdf;
  this->min_size = min_size;
  QPDFObjectHandle::QPDFObjectHandle(&this->resources,resources);
  std::__cxx11::string::string((string *)&this->dict_str);
  std::__cxx11::string::string((string *)&this->bi_str);
  this->min_suffix = 1;
  this->any_images = false;
  this->state = st_top;
  return;
}

Assistant:

InlineImageTracker::InlineImageTracker(QPDF* qpdf, size_t min_size, QPDFObjectHandle resources) :
    qpdf(qpdf),
    min_size(min_size),
    resources(resources)
{
}